

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_filehandle.cc
# Opt level: O0

RC __thiscall PF_FileHandle::DisposePage(PF_FileHandle *this,PageNum pageNum)

{
  int iVar1;
  int *local_28;
  char *pPageBuf;
  int rc;
  PageNum pageNum_local;
  PF_FileHandle *this_local;
  
  if (this->bFileOpen == 0) {
    this_local._4_4_ = 5;
  }
  else {
    pPageBuf._4_4_ = pageNum;
    _rc = this;
    iVar1 = IsValidPageNum(this,pageNum);
    if (iVar1 == 0) {
      this_local._4_4_ = 3;
    }
    else {
      pPageBuf._0_4_ =
           PF_BufferMgr::GetPage(this->pBufferMgr,this->unixfd,pPageBuf._4_4_,(char **)&local_28,0);
      this_local._4_4_ = (RC)pPageBuf;
      if ((RC)pPageBuf == 0) {
        if (*local_28 == -2) {
          *local_28 = (this->hdr).firstFree;
          (this->hdr).firstFree = pPageBuf._4_4_;
          this->bHdrChanged = 1;
          pPageBuf._0_4_ = MarkDirty(this,pPageBuf._4_4_);
          this_local._4_4_ = (RC)pPageBuf;
          if (((RC)pPageBuf == 0) &&
             (this_local._4_4_ = UnpinPage(this,pPageBuf._4_4_), this_local._4_4_ == 0)) {
            this_local._4_4_ = 0;
          }
        }
        else {
          this_local._4_4_ = UnpinPage(this,pPageBuf._4_4_);
          if (this_local._4_4_ == 0) {
            this_local._4_4_ = 6;
          }
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

RC PF_FileHandle::DisposePage(PageNum pageNum)
{
   int     rc;               // return code
   char    *pPageBuf;        // address of page in buffer pool

   // File must be open
   if (!bFileOpen)
      return (PF_CLOSEDFILE);

   // Validate page number
   if (!IsValidPageNum(pageNum))
      return (PF_INVALIDPAGE);

   // Get the page (but don't re-pin it if it's already pinned)
   if ((rc = pBufferMgr->GetPage(unixfd,
         pageNum,
         &pPageBuf,
         FALSE)))
      return (rc);

   // Page must be valid (used)
   if (((PF_PageHdr *)pPageBuf)->nextFree != PF_PAGE_USED) {

      // Unpin the page
      if ((rc = UnpinPage(pageNum)))
         return (rc);

      // Return page already free
      return (PF_PAGEFREE);
   }

   // Put this page onto the free list
   ((PF_PageHdr *)pPageBuf)->nextFree = hdr.firstFree;
   hdr.firstFree = pageNum;
   bHdrChanged = TRUE;

   // Mark the page dirty because we changed the next pointer
   if ((rc = MarkDirty(pageNum)))
      return (rc);

   // Unpin the page
   if ((rc = UnpinPage(pageNum)))
      return (rc);

   // Return ok
   return (0);
}